

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>
           *this,bit_array *x,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,double kappa,
          double delta,double theta,double obj_amp)

{
  solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>
  *reduced_cost;
  undefined1 auVar1 [16];
  int k;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *plVar2;
  bool bVar3;
  uint r_size;
  int selected;
  int iVar4;
  _Head_base<0UL,_int_*,_false> _Var5;
  long lVar6;
  __uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
  _Var7;
  double *pdVar8;
  rc_data *ret_1;
  rc_data *prVar9;
  rc_data *prVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  rc_data *ret;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  undefined1 local_70 [16];
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_60;
  double local_58;
  unique_ptr<baryonyx::sparse_matrix<int>::row_value[],_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_50;
  double local_48;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  local_40;
  undefined8 local_38;
  
  if (first._M_current == last._M_current) {
    local_38._0_4_ = 0;
    local_38._4_4_ = 0;
  }
  else {
    local_60._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl =
         (tuple<int_*,_std::default_delete<int[]>_>)((long)this + 0x10);
    reduced_cost = this + 0x60;
    local_38._0_4_ = 0;
    local_38._4_4_ = 0;
    local_58 = theta;
    local_50._M_t.
    super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
         (__uniq_ptr_data<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>,_true,_true>
          )(__uniq_ptr_data<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>,_true,_true>
            )kappa;
    local_48 = delta;
    local_40._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
          )(tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
            )obj_amp;
    do {
      k = *first._M_current;
      sparse_matrix<int>::row
                ((sparse_matrix<int> *)local_70,
                 (int)local_60._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                      super__Head_base<0UL,_int_*,_false>._M_head_impl);
      if (local_70._8_8_ != local_70._0_8_) {
        lVar6 = *(long *)(this + 0x50);
        _Var5._M_head_impl = (int *)local_70._8_8_;
        do {
          *(double *)(lVar6 + (long)*_Var5._M_head_impl * 8) =
               local_58 * *(double *)(lVar6 + (long)*_Var5._M_head_impl * 8);
          _Var5._M_head_impl = _Var5._M_head_impl + 8;
        } while (_Var5._M_head_impl != (int *)local_70._0_8_);
      }
      r_size = solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
               ::compute_reduced_costs<baryonyx::bit_array>
                         ((solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                           *)this,(row_iterator)local_70._8_8_,(row_iterator)local_70._0_8_,x);
      auVar18._8_8_ = 0;
      auVar18._0_8_ =
           local_40._M_t.
           super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
           .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl;
      if (r_size != 0) {
        lVar6 = *(long *)(this + 0x60);
        lVar16 = *(long *)(*(long *)(this + 0x168) + 8);
        lVar13 = 0;
        do {
          auVar17._8_8_ = 0;
          auVar17._0_8_ =
               *(ulong *)(lVar16 + (long)((row_iterator)
                                         (local_70._8_8_ + (long)*(int *)(lVar6 + 8 + lVar13) * 8))
                                         ->column * 8);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *(ulong *)(lVar6 + lVar13);
          auVar1 = vfmadd213sd_fma(auVar17,auVar18,auVar1);
          *(long *)(lVar6 + lVar13) = auVar1._0_8_;
          lVar13 = lVar13 + 0x10;
        } while ((ulong)r_size << 4 != lVar13);
      }
      lVar6 = (long)k;
      switch(*(undefined1 *)(*(long *)(this + 0x68) + lVar6)) {
      case 0:
        if (1 < (int)r_size) {
          plVar2 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar10 = *(rc_data **)(this + 0x60);
          lVar16 = (long)(int)r_size;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar10,prVar10 + lVar16,(int)LZCOUNT(lVar16) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar10,prVar10 + lVar16);
          prVar9 = prVar10 + 1;
          lVar16 = lVar16 * 0x10 + -0x10;
          do {
            if ((prVar10->value != prVar9->value) || (NAN(prVar10->value) || NAN(prVar9->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar10,prVar9,plVar2);
              prVar10 = prVar9;
            }
            prVar9 = prVar9 + 1;
            lVar16 = lVar16 + -0x10;
          } while (lVar16 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar10,prVar9,plVar2);
        }
        iVar4 = *(int *)(*(long *)(this + 0x70) + lVar6 * 0xc);
        iVar12 = *(int *)(*(long *)(this + 0x70) + 4 + lVar6 * 0xc);
LAB_00547333:
        selected = branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::
                   solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data[]>>>
                             ((branch_and_bound_solver<baryonyx::itm::maximize_tag,double> *)
                              (this + 0x80),
                              (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                               *)reduced_cost,r_size,iVar4,iVar12);
        break;
      case 1:
switchD_00546f66_caseD_1:
        selected = exhaustive_solver<baryonyx::itm::maximize_tag,double>::
                   solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data[]>>>
                             ((exhaustive_solver<baryonyx::itm::maximize_tag,double> *)(this + 0xf0)
                              ,k,(unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                                  *)reduced_cost,r_size);
        break;
      case 2:
        if (1 < (int)r_size) {
          plVar2 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar10 = *(rc_data **)(this + 0x60);
          lVar16 = (long)(int)r_size;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar10,prVar10 + lVar16,(int)LZCOUNT(lVar16) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar10,prVar10 + lVar16);
          prVar9 = prVar10 + 1;
          lVar16 = lVar16 * 0x10 + -0x10;
          do {
            if ((prVar10->value != prVar9->value) || (NAN(prVar10->value) || NAN(prVar9->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar10,prVar9,plVar2);
              prVar10 = prVar9;
            }
            prVar9 = prVar9 + 1;
            lVar16 = lVar16 + -0x10;
          } while (lVar16 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar10,prVar9,plVar2);
        }
        iVar4 = *(int *)(*(long *)(this + 0x70) + lVar6 * 0xc);
        iVar12 = *(int *)(*(long *)(this + 0x70) + 4 + lVar6 * 0xc);
        if ((int)r_size < 0) {
          selected = -2;
        }
        else {
          _Var7._M_t.
          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
          .
          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
          ._M_head_impl =
               *(tuple<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                 *)reduced_cost;
          iVar11 = 0;
          selected = -2;
          uVar15 = 0xffffffffffffffff;
          do {
            iVar14 = (int)uVar15;
            if (iVar12 < iVar11) {
              iVar14 = selected;
            }
            if (iVar11 < iVar4) {
              iVar14 = selected;
            }
            selected = iVar14;
            if ((selected != -2) &&
               (*(double *)
                 _Var7._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
                 ._M_head_impl < 0.0)) break;
            uVar15 = uVar15 + 1;
            iVar11 = iVar11 + *(int *)((long)_Var7._M_t.
                                             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                                             .
                                             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
                                             ._M_head_impl + 0xc);
            _Var7._M_t.
            super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
            .
            super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
            ._M_head_impl =
                 (tuple<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                  )((long)_Var7._M_t.
                          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                          .
                          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
                          ._M_head_impl + 0x10);
          } while (r_size != uVar15);
        }
        if (selected == -2) goto LAB_00547333;
        break;
      case 3:
        if (1 < (int)r_size) {
          plVar2 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar10 = *(rc_data **)(this + 0x60);
          lVar16 = (long)(int)r_size;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar10,prVar10 + lVar16,(int)LZCOUNT(lVar16) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar10,prVar10 + lVar16);
          prVar9 = prVar10 + 1;
          lVar16 = lVar16 * 0x10 + -0x10;
          do {
            if ((prVar10->value != prVar9->value) || (NAN(prVar10->value) || NAN(prVar9->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar10,prVar9,plVar2);
              prVar10 = prVar9;
            }
            prVar9 = prVar9 + 1;
            lVar16 = lVar16 + -0x10;
          } while (lVar16 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar10,prVar9,plVar2);
        }
        if ((int)r_size < 0) {
          selected = -2;
        }
        else {
          _Var7._M_t.
          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
          .
          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
          ._M_head_impl =
               *(tuple<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                 *)reduced_cost;
          iVar12 = 0;
          uVar15 = 0xffffffffffffffff;
          iVar4 = -2;
          do {
            selected = (int)uVar15;
            if (*(int *)(*(long *)(this + 0x70) + 4 + lVar6 * 0xc) < iVar12) {
              selected = iVar4;
            }
            if (iVar12 < *(int *)(*(long *)(this + 0x70) + lVar6 * 0xc)) {
              selected = iVar4;
            }
            if ((selected != -2) &&
               (*(double *)
                 _Var7._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
                 ._M_head_impl < 0.0)) break;
            uVar15 = uVar15 + 1;
            iVar12 = iVar12 + *(int *)((long)_Var7._M_t.
                                             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                                             .
                                             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
                                             ._M_head_impl + 0xc);
            _Var7._M_t.
            super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
            .
            super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
            ._M_head_impl =
                 (tuple<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                  )((long)_Var7._M_t.
                          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                          .
                          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
                          ._M_head_impl + 0x10);
            iVar4 = selected;
          } while (r_size != uVar15);
        }
        if (selected == -2) goto switchD_00546f66_caseD_1;
        break;
      default:
        if (1 < (int)r_size) {
          plVar2 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar10 = *(rc_data **)(this + 0x60);
          lVar16 = (long)(int)r_size;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar10,prVar10 + lVar16,(int)LZCOUNT(lVar16) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar10,prVar10 + lVar16);
          prVar9 = prVar10 + 1;
          lVar16 = lVar16 * 0x10 + -0x10;
          do {
            if ((prVar10->value != prVar9->value) || (NAN(prVar10->value) || NAN(prVar9->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar10,prVar9,plVar2);
              prVar10 = prVar9;
            }
            prVar9 = prVar9 + 1;
            lVar16 = lVar16 + -0x10;
          } while (lVar16 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar10,prVar9,plVar2);
        }
        if ((int)r_size < 0) {
          selected = -2;
        }
        else {
          pdVar8 = *(double **)(this + 0x60);
          iVar12 = 0;
          uVar15 = 0xffffffffffffffff;
          iVar4 = -2;
          do {
            selected = (int)uVar15;
            if (*(int *)(*(long *)(this + 0x70) + 4 + lVar6 * 0xc) < iVar12) {
              selected = iVar4;
            }
            if (iVar12 < *(int *)(*(long *)(this + 0x70) + lVar6 * 0xc)) {
              selected = iVar4;
            }
            if ((selected != -2) && (*pdVar8 < 0.0)) break;
            uVar15 = uVar15 + 1;
            iVar12 = iVar12 + *(int *)((long)pdVar8 + 0xc);
            pdVar8 = pdVar8 + 2;
            iVar4 = selected;
          } while (r_size != uVar15);
        }
      }
      bVar3 = local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
                        (this,x,(row_value *)local_70._8_8_,k,selected,r_size,
                         (double)local_50._M_t.
                                 super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                 .
                                 super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                 ._M_head_impl,local_48);
      local_38._0_1_ = (byte)local_38 | bVar3;
      first._M_current = first._M_current + 1;
    } while (first._M_current != last._M_current);
  }
  return (bool)((byte)local_38 & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            Float pi_change;
            int selected;

            switch (Z[k]) {
            case subsolver_type::branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::exhaustive:
                selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::unconstrained_branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::unconstrained_exhaustive:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::linear:
            default:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables_101(r_size, b[k].min, b[k].max);
                break;
            }

            pi_change = local_affect(
              x, std::get<0>(it), k, selected, r_size, kappa, delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }